

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

int __thiscall NodeFS::GetType(NodeFS *this)

{
  pointer ppNVar1;
  
  while( true ) {
    if (this->type_ != -1) {
      return this->type_;
    }
    ppNVar1 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppNVar1 ==
        (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    this = *ppNVar1;
  }
  return 0;
}

Assistant:

int NodeFS::GetType()
{
   if (type_ != -1) return type_;
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      int type_node = (*it)->GetType();
      if (type_node != -1)
         return type_node;
   }
   return 0;
}